

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall chrono::ChArchiveOut::out<char,12ul>(ChArchiveOut *this,ChNameValue<char[12]> *bVal)

{
  size_t i;
  long lVar1;
  char *local_98;
  char *local_90;
  undefined1 local_88;
  ChValueSpecific<char[12]> specVal;
  char buffer [20];
  
  ChValueSpecific<char[12]>::ChValueSpecific(&specVal,bVal->_value,bVal->_name,bVal->_flags);
  (*(this->super_ChArchive)._vptr_ChArchive[0xe])(this,&specVal,0xc);
  for (lVar1 = 0; lVar1 != 0xc; lVar1 = lVar1 + 1) {
    sprintf(buffer,"%lu",lVar1);
    local_90 = *bVal->_value + lVar1;
    local_88 = 0;
    local_98 = buffer;
    (*(this->super_ChArchive)._vptr_ChArchive[6])(this,&local_98);
    (*(this->super_ChArchive)._vptr_ChArchive[0xf])(this,&specVal,0xc);
  }
  (*(this->super_ChArchive)._vptr_ChArchive[0x10])(this,&specVal,0xc);
  ChValue::~ChValue(&specVal.super_ChValue);
  return;
}

Assistant:

void out     (ChNameValue<T[N]> bVal) {
          size_t arraysize = sizeof(bVal.value())/sizeof(T);
          ChValueSpecific<T[N]> specVal(bVal.value(), bVal.name(), bVal.flags());
          this->out_array_pre( specVal, arraysize);
          for (size_t i = 0; i<arraysize; ++i)
          {
              char buffer[20];
              sprintf(buffer, "%lu", (unsigned long)i);
              ChNameValue< T > array_val(buffer, bVal.value()[i]);
              this->out (array_val);
              this->out_array_between(specVal, arraysize);
          }
          this->out_array_end(specVal, arraysize);
      }